

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O2

int __thiscall
Darts::DoubleArrayImpl<void,_void,_int,_void>::exactMatchSearch<int>
          (DoubleArrayImpl<void,_void,_int,_void> *this,key_type *key,size_t length,size_t node_pos)

{
  byte *pbVar1;
  unit_type *puVar2;
  uint uVar3;
  uint uVar4;
  size_t i;
  size_t sVar5;
  
  puVar2 = this->array_;
  uVar3 = puVar2[node_pos].unit_;
  if (length == 0) {
    do {
      uVar4 = (uint)(byte)*key;
      if (uVar4 == 0) goto LAB_001d9dd9;
      node_pos = node_pos ^ ((uVar3 >> 10) << ((byte)(uVar3 >> 6) & 8) ^ uVar4);
      uVar3 = puVar2[node_pos].unit_;
      key = (key_type *)((byte *)key + 1);
    } while ((uVar3 & 0x800000ff) == uVar4);
  }
  else {
    sVar5 = 0;
    do {
      if (length == sVar5) {
LAB_001d9dd9:
        if ((uVar3 >> 8 & 1) == 0) {
          return -1;
        }
        return puVar2[node_pos ^ (uVar3 >> 10) << ((byte)(uVar3 >> 6) & 8)].unit_ & 0x7fffffff;
      }
      pbVar1 = (byte *)(key + sVar5);
      node_pos = node_pos ^ ((uVar3 >> 10) << ((byte)(uVar3 >> 6) & 8) ^ (uint)*pbVar1);
      uVar3 = puVar2[node_pos].unit_;
      sVar5 = sVar5 + 1;
    } while ((uVar3 & 0x800000ff) == (uint)*pbVar1);
  }
  return -1;
}

Assistant:

inline U DoubleArrayImpl<A, B, T, C>::exactMatchSearch(const key_type *key,
    std::size_t length, std::size_t node_pos) const {
  U result;
  set_result(&result, static_cast<value_type>(-1), 0);

  unit_type unit = array_[node_pos];
  if (length != 0) {
    for (std::size_t i = 0; i < length; ++i) {
      node_pos ^= unit.offset() ^ static_cast<uchar_type>(key[i]);
      unit = array_[node_pos];
      if (unit.label() != static_cast<uchar_type>(key[i])) {
        return result;
      }
    }
  } else {
    for ( ; key[length] != '\0'; ++length) {
      node_pos ^= unit.offset() ^ static_cast<uchar_type>(key[length]);
      unit = array_[node_pos];
      if (unit.label() != static_cast<uchar_type>(key[length])) {
        return result;
      }
    }
  }

  if (!unit.has_leaf()) {
    return result;
  }
  unit = array_[node_pos ^ unit.offset()];
  set_result(&result, static_cast<value_type>(unit.value()), length);
  return result;
}